

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall
Catch::TestCaseTracking::TrackerBase::TrackerBase
          (TrackerBase *this,NameAndLocation *nameAndLocation,TrackerContext *ctx,ITracker *parent)

{
  ITracker *in_RCX;
  size_type in_RDX;
  NameAndLocation *in_RDI;
  
  ITracker::ITracker(in_RCX,in_RDI);
  *(undefined ***)&in_RDI->name = &PTR__TrackerBase_002f15b0;
  in_RDI[1].name._M_string_length = in_RDX;
  in_RDI[1].name.field_2._M_allocated_capacity = (size_type)in_RCX;
  clara::std::
  vector<std::shared_ptr<Catch::TestCaseTracking::ITracker>,_std::allocator<std::shared_ptr<Catch::TestCaseTracking::ITracker>_>_>
  ::vector((vector<std::shared_ptr<Catch::TestCaseTracking::ITracker>,_std::allocator<std::shared_ptr<Catch::TestCaseTracking::ITracker>_>_>
            *)0x138ed8);
  *(undefined4 *)&in_RDI[2].name = 0;
  return;
}

Assistant:

TrackerBase::TrackerBase( NameAndLocation const& nameAndLocation, TrackerContext& ctx, ITracker* parent ):
        ITracker(nameAndLocation),
        m_ctx( ctx ),
        m_parent( parent )
    {}